

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_sse4.c
# Opt level: O1

void av1_compute_stats_highbd_sse4_1
               (int wiener_win,uint8_t *dgd8,uint8_t *src8,int16_t *dgd_avg,int16_t *src_avg,
               int h_start,int h_end,int v_start,int v_end,int dgd_stride,int src_stride,int64_t *M,
               int64_t *H,aom_bit_depth_t bit_depth)

{
  long *plVar1;
  undefined8 *puVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  undefined4 uVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  uint uVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  int64_t *piVar23;
  long *plVar24;
  undefined1 (*pauVar25) [16];
  undefined1 (*pauVar26) [16];
  int64_t *piVar27;
  long lVar28;
  long lVar29;
  ulong uVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  undefined1 *puVar35;
  long lVar36;
  int *piVar37;
  int *piVar38;
  long lVar39;
  undefined1 (*pauVar40) [16];
  long lVar41;
  long lVar42;
  undefined1 *puVar43;
  undefined1 *puVar44;
  long lVar45;
  int iVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  int64_t M_int [7] [7];
  int64_t H_int [49] [56];
  long local_5898;
  long local_5890;
  undefined1 local_5858 [16];
  undefined1 local_5848 [16];
  undefined1 local_5838 [16];
  undefined1 local_5828 [16];
  undefined1 local_5818 [16];
  undefined1 local_5808 [16];
  undefined4 local_57f8;
  long local_5788 [50];
  undefined1 local_55f8 [304];
  undefined1 local_54c8 [128];
  undefined1 local_5448 [21528];
  
  if (wiener_win == 5) {
    lVar17 = (long)dgd8 * 2;
    iVar46 = 0;
    if (v_start < v_end) {
      lVar33 = (long)v_start;
      lVar39 = lVar17 + dgd_stride * lVar33 * 2;
      uVar11 = 0;
      do {
        lVar22 = (long)h_start;
        if (h_start < h_end) {
          do {
            uVar11 = uVar11 + *(ushort *)(lVar39 + lVar22 * 2);
            lVar22 = lVar22 + 1;
          } while (h_end != lVar22);
        }
        lVar33 = lVar33 + 1;
        lVar39 = lVar39 + (long)dgd_stride * 2;
      } while (lVar33 != v_end);
    }
    else {
      uVar11 = 0;
    }
    uVar13 = (ulong)((v_end - v_start) * (h_end - h_start));
    memset(local_5788,0,200);
    memset(local_55f8,0,8000);
    local_5808 = (undefined1  [16])0x0;
    local_5818 = (undefined1  [16])0x0;
    local_5828 = (undefined1  [16])0x0;
    local_5838 = (undefined1  [16])0x0;
    local_5848 = (undefined1  [16])0x0;
    local_5858 = (undefined1  [16])0x0;
    local_57f8 = 0;
    if (v_start < v_end) {
      lVar33 = (long)(dgd_stride * 2);
      lVar41 = (long)dgd_stride;
      lVar14 = (long)(dgd_stride * 3);
      lVar15 = (long)(dgd_stride << 2);
      lVar34 = (long)v_start;
      lVar29 = (long)h_start * 2 + lVar41 * lVar34 * 2 + lVar33 * -2 + lVar17 + -4;
      lVar39 = lVar41 * 2;
      lVar22 = lVar41 * lVar34 * 2 + lVar33 * -2 + lVar17 + -4;
      iVar46 = 0;
      do {
        iVar18 = (int)lVar34;
        iVar9 = v_end - iVar18;
        if (iVar9 != 0 && iVar18 <= v_end) {
          if (0x3f < iVar9) {
            iVar9 = 0x40;
          }
          lVar16 = lVar34;
          lVar32 = lVar22;
          lVar36 = lVar29;
          do {
            uVar30 = (ulong)(uint)h_start;
            lVar28 = lVar17 + lVar33 * -2 + -4 + lVar16 * lVar41 * 2;
            lVar42 = (long)src8 * 2 + lVar16 * src_stride * 2;
            uVar21 = (long)h_start;
            lVar20 = lVar36;
            if (h_start < (int)(h_end & 0xfffffffeU)) {
              do {
                uVar3 = *(ushort *)(lVar42 + uVar21 * 2);
                uVar4 = *(ushort *)(lVar42 + 2 + uVar21 * 2);
                pauVar40 = (undefined1 (*) [16])(lVar28 + uVar21 * 2);
                pauVar25 = (undefined1 (*) [16])local_54c8;
                puVar35 = local_5858;
                plVar24 = local_5788;
                lVar31 = 0;
                lVar12 = lVar20;
                do {
                  lVar45 = 0;
                  pauVar26 = pauVar25;
                  do {
                    uVar5 = *(ushort *)(lVar12 + lVar45);
                    uVar6 = *(ushort *)(lVar12 + 2 + lVar45);
                    *(uint *)(puVar35 + lVar45 * 2) =
                         *(int *)(puVar35 + lVar45 * 2) + (uint)uVar6 + (uint)uVar5;
                    uVar10 = (uint)uVar3;
                    uVar19 = (uint)uVar4;
                    plVar1 = (long *)((long)plVar24 + lVar45 * 4);
                    *plVar1 = *plVar1 + (ulong)(uVar6 * uVar19 + uVar5 * uVar10);
                    uVar7 = *(undefined4 *)(lVar12 + lVar45);
                    auVar49._4_4_ = uVar7;
                    auVar49._0_4_ = uVar7;
                    auVar49._8_4_ = uVar7;
                    auVar49._12_4_ = uVar7;
                    auVar50 = pshufb(*pauVar40,_DAT_00515b90);
                    auVar50 = pmaddwd(auVar50,auVar49);
                    auVar64 = pshufb(*(undefined1 (*) [16])(*pauVar40 + 8),_DAT_00515b90);
                    auVar64 = pmaddwd(auVar64,auVar49);
                    auVar75 = pmovzxdq(in_XMM5,auVar50);
                    auVar108._0_8_ = auVar75._0_8_ + *(long *)pauVar26[-0x13];
                    auVar108._8_8_ = auVar75._8_8_ + *(long *)(pauVar26[-0x13] + 8);
                    pauVar26[-0x13] = auVar108;
                    lVar8 = *(long *)(pauVar26[-0x12] + 8);
                    auVar75 = pmovzxdq(auVar108,auVar64);
                    *(ulong *)pauVar26[-0x12] = (ulong)auVar50._8_4_ + *(long *)pauVar26[-0x12];
                    *(ulong *)(pauVar26[-0x12] + 8) = (ulong)auVar50._12_4_ + lVar8;
                    auVar97._0_8_ = auVar75._0_8_ + *(long *)pauVar26[-0x11];
                    auVar97._8_8_ = auVar75._8_8_ + *(long *)(pauVar26[-0x11] + 8);
                    pauVar26[-0x11] = auVar97;
                    lVar8 = *(long *)(pauVar26[-0x10] + 8);
                    *(ulong *)pauVar26[-0x10] = (ulong)auVar64._8_4_ + *(long *)pauVar26[-0x10];
                    *(ulong *)(pauVar26[-0x10] + 8) = (ulong)auVar64._12_4_ + lVar8;
                    auVar50 = pshufb(*(undefined1 (*) [16])(*pauVar40 + lVar41 * 2),_DAT_00515b90);
                    auVar50 = pmaddwd(auVar50,auVar49);
                    auVar64 = pshufb(*(undefined1 (*) [16])(*pauVar40 + lVar41 * 2 + 8),
                                     _DAT_00515b90);
                    auVar64 = pmaddwd(auVar64,auVar49);
                    auVar75 = pmovzxdq(auVar97,auVar50);
                    auVar108 = pmovzxdq(in_XMM6,auVar64);
                    auVar98._0_8_ = auVar75._0_8_ + *(long *)pauVar26[-0xf];
                    auVar98._8_8_ = auVar75._8_8_ + *(long *)(pauVar26[-0xf] + 8);
                    pauVar26[-0xf] = auVar98;
                    lVar8 = *(long *)(pauVar26[-0xe] + 8);
                    *(ulong *)pauVar26[-0xe] = (ulong)auVar50._8_4_ + *(long *)pauVar26[-0xe];
                    *(ulong *)(pauVar26[-0xe] + 8) = (ulong)auVar50._12_4_ + lVar8;
                    auVar109._0_8_ = auVar108._0_8_ + *(long *)pauVar26[-0xd];
                    auVar109._8_8_ = auVar108._8_8_ + *(long *)(pauVar26[-0xd] + 8);
                    pauVar26[-0xd] = auVar109;
                    lVar8 = *(long *)(pauVar26[-0xc] + 8);
                    *(ulong *)pauVar26[-0xc] = (ulong)auVar64._8_4_ + *(long *)pauVar26[-0xc];
                    *(ulong *)(pauVar26[-0xc] + 8) = (ulong)auVar64._12_4_ + lVar8;
                    auVar50 = pshufb(*(undefined1 (*) [16])(*pauVar40 + lVar33 * 2),_DAT_00515b90);
                    auVar50 = pmaddwd(auVar50,auVar49);
                    auVar64 = pshufb(*(undefined1 (*) [16])(*pauVar40 + lVar33 * 2 + 8),
                                     _DAT_00515b90);
                    auVar64 = pmaddwd(auVar64,auVar49);
                    auVar75 = pmovzxdq(auVar98,auVar50);
                    auVar99._0_8_ = auVar75._0_8_ + *(long *)pauVar26[-0xb];
                    auVar99._8_8_ = auVar75._8_8_ + *(long *)(pauVar26[-0xb] + 8);
                    pauVar26[-0xb] = auVar99;
                    lVar8 = *(long *)(pauVar26[-10] + 8);
                    auVar75 = pmovzxdq(auVar99,auVar64);
                    *(ulong *)pauVar26[-10] = (ulong)auVar50._8_4_ + *(long *)pauVar26[-10];
                    *(ulong *)(pauVar26[-10] + 8) = (ulong)auVar50._12_4_ + lVar8;
                    auVar100._0_8_ = auVar75._0_8_ + *(long *)pauVar26[-9];
                    auVar100._8_8_ = auVar75._8_8_ + *(long *)(pauVar26[-9] + 8);
                    pauVar26[-9] = auVar100;
                    lVar8 = *(long *)(pauVar26[-8] + 8);
                    *(ulong *)pauVar26[-8] = (ulong)auVar64._8_4_ + *(long *)pauVar26[-8];
                    *(ulong *)(pauVar26[-8] + 8) = (ulong)auVar64._12_4_ + lVar8;
                    auVar50 = pshufb(*(undefined1 (*) [16])(*pauVar40 + lVar14 * 2),_DAT_00515b90);
                    auVar50 = pmaddwd(auVar50,auVar49);
                    auVar64 = pshufb(*(undefined1 (*) [16])(*pauVar40 + lVar14 * 2 + 8),
                                     _DAT_00515b90);
                    auVar64 = pmaddwd(auVar64,auVar49);
                    auVar75 = pmovzxdq(auVar100,auVar50);
                    auVar108 = pmovzxdq(auVar109,auVar64);
                    in_XMM5._0_8_ = auVar75._0_8_ + *(long *)pauVar26[-7];
                    in_XMM5._8_8_ = auVar75._8_8_ + *(long *)(pauVar26[-7] + 8);
                    pauVar26[-7] = in_XMM5;
                    lVar8 = *(long *)(pauVar26[-6] + 8);
                    *(ulong *)pauVar26[-6] = (ulong)auVar50._8_4_ + *(long *)pauVar26[-6];
                    *(ulong *)(pauVar26[-6] + 8) = (ulong)auVar50._12_4_ + lVar8;
                    in_XMM6._0_8_ = auVar108._0_8_ + *(long *)pauVar26[-5];
                    in_XMM6._8_8_ = auVar108._8_8_ + *(long *)(pauVar26[-5] + 8);
                    pauVar26[-5] = in_XMM6;
                    lVar8 = *(long *)(pauVar26[-4] + 8);
                    *(ulong *)pauVar26[-4] = (ulong)auVar64._8_4_ + *(long *)pauVar26[-4];
                    *(ulong *)(pauVar26[-4] + 8) = (ulong)auVar64._12_4_ + lVar8;
                    auVar50 = pshufb(*(undefined1 (*) [16])(*pauVar40 + lVar15 * 2),_DAT_00515b90);
                    auVar64 = pmaddwd(auVar50,auVar49);
                    auVar50 = pshufb(*(undefined1 (*) [16])(*pauVar40 + lVar15 * 2 + 8),
                                     _DAT_00515b90);
                    auVar75 = pmaddwd(auVar50,auVar49);
                    auVar49 = pmovzxdq(auVar49,auVar64);
                    auVar50._0_8_ = auVar49._0_8_ + *(long *)pauVar26[-3];
                    auVar50._8_8_ = auVar49._8_8_ + *(long *)(pauVar26[-3] + 8);
                    pauVar26[-3] = auVar50;
                    in_XMM3._0_8_ = (ulong)auVar64._8_4_ + *(long *)pauVar26[-2];
                    in_XMM3._8_8_ = (ulong)auVar64._12_4_ + *(long *)(pauVar26[-2] + 8);
                    auVar49 = pmovzxdq(auVar50,auVar75);
                    pauVar26[-2] = in_XMM3;
                    lVar8 = *(long *)(pauVar26[-1] + 8);
                    *(long *)pauVar26[-1] = auVar49._0_8_ + *(long *)pauVar26[-1];
                    *(long *)(pauVar26[-1] + 8) = auVar49._8_8_ + lVar8;
                    in_XMM4._0_8_ = (ulong)auVar75._8_4_ + *(long *)*pauVar26;
                    in_XMM4._8_8_ = (ulong)auVar75._12_4_ + *(long *)(*pauVar26 + 8);
                    *pauVar26 = in_XMM4;
                    lVar45 = lVar45 + 2;
                    pauVar26 = pauVar26 + 100;
                  } while (lVar45 != 10);
                  lVar31 = lVar31 + 1;
                  plVar24 = plVar24 + 5;
                  puVar35 = puVar35 + 0x14;
                  lVar12 = lVar12 + lVar39;
                  pauVar25 = pauVar25 + 0x14;
                } while (lVar31 != 5);
                iVar46 = iVar46 + uVar10 + uVar19;
                uVar30 = uVar21 + 2;
                uVar21 = uVar30;
                lVar20 = lVar20 + 4;
              } while ((long)uVar30 < (long)(int)(h_end & 0xfffffffeU));
            }
            if ((h_end & 1U) != 0) {
              lVar20 = (long)(int)uVar30;
              uVar3 = *(ushort *)(lVar42 + lVar20 * 2);
              puVar2 = (undefined8 *)(lVar28 + lVar20 * 2);
              lVar28 = lVar32 + lVar20 * 2;
              pauVar40 = (undefined1 (*) [16])local_54c8;
              puVar35 = local_5858;
              plVar24 = local_5788;
              lVar42 = 0;
              do {
                lVar20 = 0;
                pauVar25 = pauVar40;
                do {
                  uVar4 = *(ushort *)(lVar28 + lVar20);
                  *(uint *)(puVar35 + lVar20 * 2) =
                       *(int *)(puVar35 + lVar20 * 2) + CONCAT22(0,uVar4);
                  uVar10 = (uint)uVar3;
                  plVar1 = (long *)((long)plVar24 + lVar20 * 4);
                  *plVar1 = *plVar1 + (ulong)(uVar4 * uVar10);
                  auVar49 = pmovzxwd(in_XMM3,*puVar2);
                  auVar64._4_2_ = uVar4;
                  auVar64._0_4_ = CONCAT22(0,uVar4);
                  auVar64._6_2_ = 0;
                  auVar64._8_2_ = uVar4;
                  auVar64._10_2_ = 0;
                  auVar64._12_2_ = uVar4;
                  auVar64._14_2_ = 0;
                  auVar49 = pmaddwd(auVar49,auVar64);
                  auVar50 = pmovzxwd(in_XMM4,puVar2[1]);
                  auVar50 = pmaddwd(auVar50,auVar64);
                  auVar75 = pmovzxdq(in_XMM5,auVar49);
                  auVar101._0_8_ = auVar75._0_8_ + *(long *)pauVar25[-0x13];
                  auVar101._8_8_ = auVar75._8_8_ + *(long *)(pauVar25[-0x13] + 8);
                  pauVar25[-0x13] = auVar101;
                  auVar60._0_8_ = (ulong)auVar49._8_4_ + *(long *)pauVar25[-0x12];
                  auVar60._8_8_ = (ulong)auVar49._12_4_ + *(long *)(pauVar25[-0x12] + 8);
                  auVar49 = pmovzxdq(auVar101,auVar50);
                  pauVar25[-0x12] = auVar60;
                  auVar102._0_8_ = auVar49._0_8_ + *(long *)pauVar25[-0x11];
                  auVar102._8_8_ = auVar49._8_8_ + *(long *)(pauVar25[-0x11] + 8);
                  pauVar25[-0x11] = auVar102;
                  auVar71._0_8_ = (ulong)auVar50._8_4_ + *(long *)pauVar25[-0x10];
                  auVar71._8_8_ = (ulong)auVar50._12_4_ + *(long *)(pauVar25[-0x10] + 8);
                  pauVar25[-0x10] = auVar71;
                  auVar49 = pmovzxwd(auVar60,*(undefined8 *)((long)puVar2 + lVar41 * 2));
                  auVar49 = pmaddwd(auVar49,auVar64);
                  auVar50 = pmovzxwd(auVar71,*(undefined8 *)((long)puVar2 + lVar41 * 2 + 8));
                  auVar50 = pmaddwd(auVar50,auVar64);
                  auVar75 = pmovzxdq(auVar102,auVar49);
                  auVar103._0_8_ = auVar75._0_8_ + *(long *)pauVar25[-0xf];
                  auVar103._8_8_ = auVar75._8_8_ + *(long *)(pauVar25[-0xf] + 8);
                  pauVar25[-0xf] = auVar103;
                  auVar61._0_8_ = (ulong)auVar49._8_4_ + *(long *)pauVar25[-0xe];
                  auVar61._8_8_ = (ulong)auVar49._12_4_ + *(long *)(pauVar25[-0xe] + 8);
                  auVar49 = pmovzxdq(auVar103,auVar50);
                  pauVar25[-0xe] = auVar61;
                  auVar104._0_8_ = auVar49._0_8_ + *(long *)pauVar25[-0xd];
                  auVar104._8_8_ = auVar49._8_8_ + *(long *)(pauVar25[-0xd] + 8);
                  pauVar25[-0xd] = auVar104;
                  auVar72._0_8_ = (ulong)auVar50._8_4_ + *(long *)pauVar25[-0xc];
                  auVar72._8_8_ = (ulong)auVar50._12_4_ + *(long *)(pauVar25[-0xc] + 8);
                  pauVar25[-0xc] = auVar72;
                  auVar49 = pmovzxwd(auVar61,*(undefined8 *)((long)puVar2 + lVar33 * 2));
                  auVar49 = pmaddwd(auVar49,auVar64);
                  auVar50 = pmovzxwd(auVar72,*(undefined8 *)((long)puVar2 + lVar33 * 2 + 8));
                  auVar50 = pmaddwd(auVar50,auVar64);
                  auVar75 = pmovzxdq(auVar104,auVar49);
                  auVar105._0_8_ = auVar75._0_8_ + *(long *)pauVar25[-0xb];
                  auVar105._8_8_ = auVar75._8_8_ + *(long *)(pauVar25[-0xb] + 8);
                  pauVar25[-0xb] = auVar105;
                  auVar62._0_8_ = (ulong)auVar49._8_4_ + *(long *)pauVar25[-10];
                  auVar62._8_8_ = (ulong)auVar49._12_4_ + *(long *)(pauVar25[-10] + 8);
                  auVar49 = pmovzxdq(auVar105,auVar50);
                  pauVar25[-10] = auVar62;
                  auVar106._0_8_ = auVar49._0_8_ + *(long *)pauVar25[-9];
                  auVar106._8_8_ = auVar49._8_8_ + *(long *)(pauVar25[-9] + 8);
                  pauVar25[-9] = auVar106;
                  auVar73._0_8_ = (ulong)auVar50._8_4_ + *(long *)pauVar25[-8];
                  auVar73._8_8_ = (ulong)auVar50._12_4_ + *(long *)(pauVar25[-8] + 8);
                  pauVar25[-8] = auVar73;
                  auVar49 = pmovzxwd(auVar62,*(undefined8 *)((long)puVar2 + lVar14 * 2));
                  auVar49 = pmaddwd(auVar49,auVar64);
                  auVar50 = pmovzxwd(auVar73,*(undefined8 *)((long)puVar2 + lVar14 * 2 + 8));
                  auVar50 = pmaddwd(auVar50,auVar64);
                  auVar75 = pmovzxdq(auVar106,auVar49);
                  auVar107._0_8_ = auVar75._0_8_ + *(long *)pauVar25[-7];
                  auVar107._8_8_ = auVar75._8_8_ + *(long *)(pauVar25[-7] + 8);
                  pauVar25[-7] = auVar107;
                  auVar63._0_8_ = (ulong)auVar49._8_4_ + *(long *)pauVar25[-6];
                  auVar63._8_8_ = (ulong)auVar49._12_4_ + *(long *)(pauVar25[-6] + 8);
                  auVar49 = pmovzxdq(auVar107,auVar50);
                  pauVar25[-6] = auVar63;
                  in_XMM5._0_8_ = auVar49._0_8_ + *(long *)pauVar25[-5];
                  in_XMM5._8_8_ = auVar49._8_8_ + *(long *)(pauVar25[-5] + 8);
                  pauVar25[-5] = in_XMM5;
                  auVar74._0_8_ = (ulong)auVar50._8_4_ + *(long *)pauVar25[-4];
                  auVar74._8_8_ = (ulong)auVar50._12_4_ + *(long *)(pauVar25[-4] + 8);
                  pauVar25[-4] = auVar74;
                  auVar49 = pmovzxwd(auVar63,*(undefined8 *)((long)puVar2 + lVar15 * 2));
                  auVar50 = pmaddwd(auVar49,auVar64);
                  auVar49 = pmovzxwd(auVar74,*(undefined8 *)((long)puVar2 + lVar15 * 2 + 8));
                  auVar108 = pmaddwd(auVar49,auVar64);
                  auVar49 = pmovzxdq(auVar64,auVar50);
                  auVar75._0_8_ = auVar49._0_8_ + *(long *)pauVar25[-3];
                  auVar75._8_8_ = auVar49._8_8_ + *(long *)(pauVar25[-3] + 8);
                  pauVar25[-3] = auVar75;
                  in_XMM3._0_8_ = (ulong)auVar50._8_4_ + *(long *)pauVar25[-2];
                  in_XMM3._8_8_ = (ulong)auVar50._12_4_ + *(long *)(pauVar25[-2] + 8);
                  auVar49 = pmovzxdq(auVar75,auVar108);
                  pauVar25[-2] = in_XMM3;
                  lVar12 = *(long *)(pauVar25[-1] + 8);
                  *(long *)pauVar25[-1] = auVar49._0_8_ + *(long *)pauVar25[-1];
                  *(long *)(pauVar25[-1] + 8) = auVar49._8_8_ + lVar12;
                  in_XMM4._0_8_ = (ulong)auVar108._8_4_ + *(long *)*pauVar25;
                  in_XMM4._8_8_ = (ulong)auVar108._12_4_ + *(long *)(*pauVar25 + 8);
                  *pauVar25 = in_XMM4;
                  lVar20 = lVar20 + 2;
                  pauVar25 = pauVar25 + 100;
                } while (lVar20 != 10);
                lVar42 = lVar42 + 1;
                plVar24 = plVar24 + 5;
                puVar35 = puVar35 + 0x14;
                lVar28 = lVar28 + lVar39;
                pauVar40 = pauVar40 + 0x14;
              } while (lVar42 != 5);
              iVar46 = iVar46 + uVar10;
            }
            lVar16 = lVar16 + 1;
            lVar36 = lVar36 + lVar39;
            lVar32 = lVar32 + lVar39;
          } while (lVar16 < iVar9 + iVar18);
        }
        lVar34 = lVar34 + 0x40;
        lVar29 = lVar29 + lVar41 * 0x80;
        lVar22 = lVar22 + lVar41 * 0x80;
      } while ((int)lVar34 < v_end);
    }
    lVar17 = 0x10;
    if (bit_depth != AOM_BITS_12) {
      lVar17 = (ulong)(bit_depth == AOM_BITS_10) * 3 + 1;
    }
    uVar11 = uVar11 / uVar13 & 0xffff;
    lVar39 = uVar13 * uVar11 * uVar11;
    lVar33 = 0;
    puVar35 = local_55f8;
    do {
      lVar22 = 0;
      puVar44 = puVar35;
      piVar23 = H;
      do {
        iVar9 = *(int *)(local_5858 + lVar22 * 4 + lVar33 * 0x14);
        M[lVar22 * 5 + lVar33] =
             (long)((local_5788[lVar33 * 5 + lVar22] + lVar39) -
                   ((long)iVar46 + (long)iVar9) * uVar11) / lVar17;
        piVar37 = (int *)local_5858;
        lVar41 = 0;
        puVar43 = puVar44;
        piVar27 = piVar23;
        do {
          lVar14 = 0;
          piVar38 = piVar37;
          do {
            *(long *)((long)piVar27 + lVar14) =
                 (long)((*(long *)(puVar43 + lVar14 * 8) + lVar39) -
                       ((long)*piVar38 + (long)iVar9) * uVar11) / lVar17;
            lVar14 = lVar14 + 8;
            piVar38 = piVar38 + 5;
          } while (lVar14 != 0x28);
          lVar41 = lVar41 + 1;
          piVar27 = piVar27 + 5;
          piVar37 = piVar37 + 1;
          puVar43 = puVar43 + 8;
        } while (lVar41 != 5);
        lVar22 = lVar22 + 1;
        piVar23 = piVar23 + 0x7d;
        puVar44 = puVar44 + 0x640;
      } while (lVar22 != 5);
      lVar33 = lVar33 + 1;
      H = H + 0x19;
      puVar35 = puVar35 + 0x140;
    } while (lVar33 != 5);
  }
  else {
    if (wiener_win != 7) {
      av1_compute_stats_highbd_c
                (wiener_win,dgd8,src8,dgd_avg,src_avg,h_start,h_end,v_start,v_end,dgd_stride,
                 src_stride,M,H,bit_depth);
      return;
    }
    lVar17 = (long)dgd8 * 2;
    iVar46 = 0;
    lVar39 = (long)dgd_stride;
    if (v_start < v_end) {
      lVar22 = (long)v_start;
      lVar33 = lVar17 + lVar39 * lVar22 * 2;
      uVar11 = 0;
      do {
        lVar41 = (long)h_start;
        if (h_start < h_end) {
          do {
            uVar11 = uVar11 + *(ushort *)(lVar33 + lVar41 * 2);
            lVar41 = lVar41 + 1;
          } while (h_end != lVar41);
        }
        lVar22 = lVar22 + 1;
        lVar33 = lVar33 + lVar39 * 2;
      } while (lVar22 != v_end);
    }
    else {
      uVar11 = 0;
    }
    uVar13 = (ulong)((v_end - v_start) * (h_end - h_start));
    memset(local_5788,0,0x188);
    memset(local_55f8,0,0x55c0);
    memset(local_5858,0,0xc4);
    auVar49 = _DAT_00515b90;
    if (v_start < v_end) {
      lVar29 = (long)v_start;
      lVar22 = (long)(dgd_stride * 3);
      lVar34 = (long)(dgd_stride * 2);
      lVar41 = (long)(dgd_stride * 4);
      lVar14 = (long)(dgd_stride * 5);
      lVar15 = (long)(dgd_stride * 6);
      local_5890 = (long)h_start * 2 + lVar39 * lVar29 * 2 + lVar22 * -2 + lVar17 + -6;
      local_5898 = lVar39 * lVar29 * 2 + lVar22 * -2 + lVar17 + -6;
      lVar33 = lVar39 * 2;
      iVar46 = 0;
      do {
        iVar18 = (int)lVar29;
        iVar9 = v_end - iVar18;
        if (iVar9 != 0 && iVar18 <= v_end) {
          if (0x3f < iVar9) {
            iVar9 = 0x40;
          }
          lVar16 = lVar29;
          lVar32 = local_5898;
          lVar36 = local_5890;
          do {
            uVar30 = (ulong)(uint)h_start;
            lVar28 = lVar17 + lVar22 * -2 + -6 + lVar16 * lVar39 * 2;
            lVar42 = (long)src8 * 2 + lVar16 * src_stride * 2;
            uVar21 = (long)h_start;
            lVar20 = lVar36;
            if (h_start < (int)(h_end & 0xfffffffeU)) {
              do {
                uVar10 = (uint)*(ushort *)(lVar42 + uVar21 * 2);
                uVar19 = (uint)*(ushort *)(lVar42 + 2 + uVar21 * 2);
                pauVar40 = (undefined1 (*) [16])(lVar28 + uVar21 * 2);
                pauVar25 = (undefined1 (*) [16])local_5448;
                puVar35 = local_5858;
                plVar24 = local_5788;
                lVar31 = 0;
                lVar12 = lVar20;
                do {
                  lVar45 = 0;
                  pauVar26 = pauVar25;
                  do {
                    uVar3 = *(ushort *)(lVar12 + lVar45);
                    uVar4 = *(ushort *)(lVar12 + 2 + lVar45);
                    *(uint *)(puVar35 + lVar45 * 2) =
                         *(int *)(puVar35 + lVar45 * 2) + (uint)uVar4 + (uint)uVar3;
                    plVar1 = (long *)((long)plVar24 + lVar45 * 4);
                    *plVar1 = *plVar1 + (ulong)(uVar4 * uVar19 + uVar3 * uVar10);
                    uVar7 = *(undefined4 *)(lVar12 + lVar45);
                    auVar47._4_4_ = uVar7;
                    auVar47._0_4_ = uVar7;
                    auVar47._8_4_ = uVar7;
                    auVar47._12_4_ = uVar7;
                    auVar50 = pshufb(*pauVar40,auVar49);
                    auVar50 = pmaddwd(auVar50,auVar47);
                    auVar64 = pshufb(*(undefined1 (*) [16])(*pauVar40 + 8),auVar49);
                    auVar75 = pmovzxdq(in_XMM5,auVar50);
                    auVar76._0_8_ = auVar75._0_8_ + *(long *)pauVar26[-0x1b];
                    auVar76._8_8_ = auVar75._8_8_ + *(long *)(pauVar26[-0x1b] + 8);
                    pauVar26[-0x1b] = auVar76;
                    lVar8 = *(long *)(pauVar26[-0x1a] + 8);
                    auVar64 = pmaddwd(auVar64,auVar47);
                    auVar75 = pmovzxdq(auVar76,auVar64);
                    *(ulong *)pauVar26[-0x1a] = (ulong)auVar50._8_4_ + *(long *)pauVar26[-0x1a];
                    *(ulong *)(pauVar26[-0x1a] + 8) = (ulong)auVar50._12_4_ + lVar8;
                    auVar77._0_8_ = auVar75._0_8_ + *(long *)pauVar26[-0x19];
                    auVar77._8_8_ = auVar75._8_8_ + *(long *)(pauVar26[-0x19] + 8);
                    pauVar26[-0x19] = auVar77;
                    lVar8 = *(long *)(pauVar26[-0x18] + 8);
                    *(ulong *)pauVar26[-0x18] = (ulong)auVar64._8_4_ + *(long *)pauVar26[-0x18];
                    *(ulong *)(pauVar26[-0x18] + 8) = (ulong)auVar64._12_4_ + lVar8;
                    auVar50 = pshufb(*(undefined1 (*) [16])(*pauVar40 + lVar39 * 2),auVar49);
                    auVar50 = pmaddwd(auVar50,auVar47);
                    auVar64 = pshufb(*(undefined1 (*) [16])(*pauVar40 + lVar39 * 2 + 8),auVar49);
                    auVar64 = pmaddwd(auVar64,auVar47);
                    auVar75 = pmovzxdq(auVar77,auVar50);
                    auVar78._0_8_ = auVar75._0_8_ + *(long *)pauVar26[-0x17];
                    auVar78._8_8_ = auVar75._8_8_ + *(long *)(pauVar26[-0x17] + 8);
                    pauVar26[-0x17] = auVar78;
                    auVar51._0_8_ = (ulong)auVar50._8_4_ + *(long *)pauVar26[-0x16];
                    auVar51._8_8_ = (ulong)auVar50._12_4_ + *(long *)(pauVar26[-0x16] + 8);
                    pauVar26[-0x16] = auVar51;
                    auVar50 = pmovzxdq(auVar51,auVar64);
                    lVar8 = *(long *)(pauVar26[-0x15] + 8);
                    *(long *)pauVar26[-0x15] = auVar50._0_8_ + *(long *)pauVar26[-0x15];
                    *(long *)(pauVar26[-0x15] + 8) = auVar50._8_8_ + lVar8;
                    lVar8 = *(long *)(pauVar26[-0x14] + 8);
                    *(ulong *)pauVar26[-0x14] = (ulong)auVar64._8_4_ + *(long *)pauVar26[-0x14];
                    *(ulong *)(pauVar26[-0x14] + 8) = (ulong)auVar64._12_4_ + lVar8;
                    auVar50 = pshufb(*(undefined1 (*) [16])(*pauVar40 + lVar34 * 2),auVar49);
                    auVar50 = pmaddwd(auVar50,auVar47);
                    auVar64 = pshufb(*(undefined1 (*) [16])(*pauVar40 + lVar34 * 2 + 8),auVar49);
                    auVar75 = pmovzxdq(auVar78,auVar50);
                    auVar79._0_8_ = auVar75._0_8_ + *(long *)pauVar26[-0x13];
                    auVar79._8_8_ = auVar75._8_8_ + *(long *)(pauVar26[-0x13] + 8);
                    pauVar26[-0x13] = auVar79;
                    lVar8 = *(long *)(pauVar26[-0x12] + 8);
                    auVar64 = pmaddwd(auVar64,auVar47);
                    auVar75 = pmovzxdq(auVar79,auVar64);
                    *(ulong *)pauVar26[-0x12] = (ulong)auVar50._8_4_ + *(long *)pauVar26[-0x12];
                    *(ulong *)(pauVar26[-0x12] + 8) = (ulong)auVar50._12_4_ + lVar8;
                    auVar80._0_8_ = auVar75._0_8_ + *(long *)pauVar26[-0x11];
                    auVar80._8_8_ = auVar75._8_8_ + *(long *)(pauVar26[-0x11] + 8);
                    pauVar26[-0x11] = auVar80;
                    lVar8 = *(long *)(pauVar26[-0x10] + 8);
                    *(ulong *)pauVar26[-0x10] = (ulong)auVar64._8_4_ + *(long *)pauVar26[-0x10];
                    *(ulong *)(pauVar26[-0x10] + 8) = (ulong)auVar64._12_4_ + lVar8;
                    auVar50 = pshufb(*(undefined1 (*) [16])(*pauVar40 + lVar22 * 2),auVar49);
                    auVar50 = pmaddwd(auVar50,auVar47);
                    auVar64 = pshufb(*(undefined1 (*) [16])(*pauVar40 + lVar22 * 2 + 8),auVar49);
                    auVar64 = pmaddwd(auVar64,auVar47);
                    auVar75 = pmovzxdq(auVar80,auVar50);
                    auVar81._0_8_ = auVar75._0_8_ + *(long *)pauVar26[-0xf];
                    auVar81._8_8_ = auVar75._8_8_ + *(long *)(pauVar26[-0xf] + 8);
                    pauVar26[-0xf] = auVar81;
                    auVar52._0_8_ = (ulong)auVar50._8_4_ + *(long *)pauVar26[-0xe];
                    auVar52._8_8_ = (ulong)auVar50._12_4_ + *(long *)(pauVar26[-0xe] + 8);
                    pauVar26[-0xe] = auVar52;
                    auVar50 = pmovzxdq(auVar52,auVar64);
                    lVar8 = *(long *)(pauVar26[-0xd] + 8);
                    *(long *)pauVar26[-0xd] = auVar50._0_8_ + *(long *)pauVar26[-0xd];
                    *(long *)(pauVar26[-0xd] + 8) = auVar50._8_8_ + lVar8;
                    lVar8 = *(long *)(pauVar26[-0xc] + 8);
                    *(ulong *)pauVar26[-0xc] = (ulong)auVar64._8_4_ + *(long *)pauVar26[-0xc];
                    *(ulong *)(pauVar26[-0xc] + 8) = (ulong)auVar64._12_4_ + lVar8;
                    auVar50 = pshufb(*(undefined1 (*) [16])(*pauVar40 + lVar41 * 2),auVar49);
                    auVar50 = pmaddwd(auVar50,auVar47);
                    auVar64 = pshufb(*(undefined1 (*) [16])(*pauVar40 + lVar41 * 2 + 8),auVar49);
                    auVar75 = pmovzxdq(auVar81,auVar50);
                    auVar82._0_8_ = auVar75._0_8_ + *(long *)pauVar26[-0xb];
                    auVar82._8_8_ = auVar75._8_8_ + *(long *)(pauVar26[-0xb] + 8);
                    pauVar26[-0xb] = auVar82;
                    lVar8 = *(long *)(pauVar26[-10] + 8);
                    auVar64 = pmaddwd(auVar64,auVar47);
                    auVar75 = pmovzxdq(auVar82,auVar64);
                    *(ulong *)pauVar26[-10] = (ulong)auVar50._8_4_ + *(long *)pauVar26[-10];
                    *(ulong *)(pauVar26[-10] + 8) = (ulong)auVar50._12_4_ + lVar8;
                    auVar83._0_8_ = auVar75._0_8_ + *(long *)pauVar26[-9];
                    auVar83._8_8_ = auVar75._8_8_ + *(long *)(pauVar26[-9] + 8);
                    pauVar26[-9] = auVar83;
                    lVar8 = *(long *)(pauVar26[-8] + 8);
                    *(ulong *)pauVar26[-8] = (ulong)auVar64._8_4_ + *(long *)pauVar26[-8];
                    *(ulong *)(pauVar26[-8] + 8) = (ulong)auVar64._12_4_ + lVar8;
                    auVar50 = pshufb(*(undefined1 (*) [16])(*pauVar40 + lVar14 * 2),auVar49);
                    auVar50 = pmaddwd(auVar50,auVar47);
                    auVar64 = pshufb(*(undefined1 (*) [16])(*pauVar40 + lVar14 * 2 + 8),auVar49);
                    auVar64 = pmaddwd(auVar64,auVar47);
                    auVar75 = pmovzxdq(auVar83,auVar50);
                    auVar84._0_8_ = auVar75._0_8_ + *(long *)pauVar26[-7];
                    auVar84._8_8_ = auVar75._8_8_ + *(long *)(pauVar26[-7] + 8);
                    pauVar26[-7] = auVar84;
                    auVar53._0_8_ = (ulong)auVar50._8_4_ + *(long *)pauVar26[-6];
                    auVar53._8_8_ = (ulong)auVar50._12_4_ + *(long *)(pauVar26[-6] + 8);
                    pauVar26[-6] = auVar53;
                    auVar50 = pmovzxdq(auVar53,auVar64);
                    lVar8 = *(long *)(pauVar26[-5] + 8);
                    *(long *)pauVar26[-5] = auVar50._0_8_ + *(long *)pauVar26[-5];
                    *(long *)(pauVar26[-5] + 8) = auVar50._8_8_ + lVar8;
                    lVar8 = *(long *)(pauVar26[-4] + 8);
                    *(ulong *)pauVar26[-4] = (ulong)auVar64._8_4_ + *(long *)pauVar26[-4];
                    *(ulong *)(pauVar26[-4] + 8) = (ulong)auVar64._12_4_ + lVar8;
                    auVar50 = pshufb(*(undefined1 (*) [16])(*pauVar40 + lVar15 * 2),auVar49);
                    auVar50 = pmaddwd(auVar50,auVar47);
                    auVar64 = pshufb(*(undefined1 (*) [16])(*pauVar40 + lVar15 * 2 + 8),auVar49);
                    auVar75 = pmovzxdq(auVar84,auVar50);
                    in_XMM5._0_8_ = auVar75._0_8_ + *(long *)pauVar26[-3];
                    in_XMM5._8_8_ = auVar75._8_8_ + *(long *)(pauVar26[-3] + 8);
                    pauVar26[-3] = in_XMM5;
                    in_XMM3._0_8_ = (ulong)auVar50._8_4_ + *(long *)pauVar26[-2];
                    in_XMM3._8_8_ = (ulong)auVar50._12_4_ + *(long *)(pauVar26[-2] + 8);
                    auVar64 = pmaddwd(auVar64,auVar47);
                    auVar50 = pmovzxdq(auVar47,auVar64);
                    pauVar26[-2] = in_XMM3;
                    lVar8 = *(long *)(pauVar26[-1] + 8);
                    *(long *)pauVar26[-1] = auVar50._0_8_ + *(long *)pauVar26[-1];
                    *(long *)(pauVar26[-1] + 8) = auVar50._8_8_ + lVar8;
                    in_XMM4._0_8_ = (ulong)auVar64._8_4_ + *(long *)*pauVar26;
                    in_XMM4._8_8_ = (ulong)auVar64._12_4_ + *(long *)(*pauVar26 + 8);
                    *pauVar26 = in_XMM4;
                    lVar45 = lVar45 + 2;
                    pauVar26 = pauVar26 + 0xc4;
                  } while (lVar45 != 0xe);
                  lVar31 = lVar31 + 1;
                  plVar24 = plVar24 + 7;
                  puVar35 = puVar35 + 0x1c;
                  lVar12 = lVar12 + lVar33;
                  pauVar25 = pauVar25 + 0x1c;
                } while (lVar31 != 7);
                iVar46 = iVar46 + uVar10 + uVar19;
                uVar30 = uVar21 + 2;
                uVar21 = uVar30;
                lVar20 = lVar20 + 4;
              } while ((long)uVar30 < (long)(int)(h_end & 0xfffffffeU));
            }
            if ((h_end & 1U) != 0) {
              lVar20 = (long)(int)uVar30;
              uVar3 = *(ushort *)(lVar42 + lVar20 * 2);
              puVar2 = (undefined8 *)(lVar28 + lVar20 * 2);
              lVar28 = lVar32 + lVar20 * 2;
              pauVar40 = (undefined1 (*) [16])local_5448;
              puVar35 = local_5858;
              plVar24 = local_5788;
              lVar42 = 0;
              do {
                lVar20 = 0;
                pauVar25 = pauVar40;
                do {
                  uVar4 = *(ushort *)(lVar28 + lVar20);
                  *(uint *)(puVar35 + lVar20 * 2) =
                       *(int *)(puVar35 + lVar20 * 2) + CONCAT22(0,uVar4);
                  uVar10 = (uint)uVar3;
                  plVar1 = (long *)((long)plVar24 + lVar20 * 4);
                  *plVar1 = *plVar1 + (ulong)(uVar4 * uVar10);
                  auVar50 = pmovzxwd(in_XMM3,*puVar2);
                  auVar48._4_2_ = uVar4;
                  auVar48._0_4_ = CONCAT22(0,uVar4);
                  auVar48._6_2_ = 0;
                  auVar48._8_2_ = uVar4;
                  auVar48._10_2_ = 0;
                  auVar48._12_2_ = uVar4;
                  auVar48._14_2_ = 0;
                  auVar50 = pmaddwd(auVar50,auVar48);
                  auVar64 = pmovzxwd(in_XMM4,puVar2[1]);
                  auVar75 = pmovzxdq(in_XMM5,auVar50);
                  auVar85._0_8_ = auVar75._0_8_ + *(long *)pauVar25[-0x1b];
                  auVar85._8_8_ = auVar75._8_8_ + *(long *)(pauVar25[-0x1b] + 8);
                  pauVar25[-0x1b] = auVar85;
                  auVar54._0_8_ = (ulong)auVar50._8_4_ + *(long *)pauVar25[-0x1a];
                  auVar54._8_8_ = (ulong)auVar50._12_4_ + *(long *)(pauVar25[-0x1a] + 8);
                  auVar50 = pmaddwd(auVar64,auVar48);
                  auVar64 = pmovzxdq(auVar85,auVar50);
                  pauVar25[-0x1a] = auVar54;
                  auVar86._0_8_ = auVar64._0_8_ + *(long *)pauVar25[-0x19];
                  auVar86._8_8_ = auVar64._8_8_ + *(long *)(pauVar25[-0x19] + 8);
                  pauVar25[-0x19] = auVar86;
                  auVar65._0_8_ = (ulong)auVar50._8_4_ + *(long *)pauVar25[-0x18];
                  auVar65._8_8_ = (ulong)auVar50._12_4_ + *(long *)(pauVar25[-0x18] + 8);
                  pauVar25[-0x18] = auVar65;
                  auVar50 = pmovzxwd(auVar54,*(undefined8 *)((long)puVar2 + lVar39 * 2));
                  auVar50 = pmaddwd(auVar50,auVar48);
                  auVar64 = pmovzxwd(auVar65,*(undefined8 *)((long)puVar2 + lVar39 * 2 + 8));
                  auVar75 = pmovzxdq(auVar86,auVar50);
                  auVar87._0_8_ = auVar75._0_8_ + *(long *)pauVar25[-0x17];
                  auVar87._8_8_ = auVar75._8_8_ + *(long *)(pauVar25[-0x17] + 8);
                  pauVar25[-0x17] = auVar87;
                  auVar55._0_8_ = (ulong)auVar50._8_4_ + *(long *)pauVar25[-0x16];
                  auVar55._8_8_ = (ulong)auVar50._12_4_ + *(long *)(pauVar25[-0x16] + 8);
                  auVar50 = pmaddwd(auVar64,auVar48);
                  auVar64 = pmovzxdq(auVar87,auVar50);
                  pauVar25[-0x16] = auVar55;
                  auVar88._0_8_ = auVar64._0_8_ + *(long *)pauVar25[-0x15];
                  auVar88._8_8_ = auVar64._8_8_ + *(long *)(pauVar25[-0x15] + 8);
                  pauVar25[-0x15] = auVar88;
                  auVar66._0_8_ = (ulong)auVar50._8_4_ + *(long *)pauVar25[-0x14];
                  auVar66._8_8_ = (ulong)auVar50._12_4_ + *(long *)(pauVar25[-0x14] + 8);
                  pauVar25[-0x14] = auVar66;
                  auVar50 = pmovzxwd(auVar55,*(undefined8 *)((long)puVar2 + lVar34 * 2));
                  auVar50 = pmaddwd(auVar50,auVar48);
                  auVar64 = pmovzxwd(auVar66,*(undefined8 *)((long)puVar2 + lVar34 * 2 + 8));
                  auVar75 = pmovzxdq(auVar88,auVar50);
                  auVar89._0_8_ = auVar75._0_8_ + *(long *)pauVar25[-0x13];
                  auVar89._8_8_ = auVar75._8_8_ + *(long *)(pauVar25[-0x13] + 8);
                  pauVar25[-0x13] = auVar89;
                  auVar56._0_8_ = (ulong)auVar50._8_4_ + *(long *)pauVar25[-0x12];
                  auVar56._8_8_ = (ulong)auVar50._12_4_ + *(long *)(pauVar25[-0x12] + 8);
                  auVar50 = pmaddwd(auVar64,auVar48);
                  auVar64 = pmovzxdq(auVar89,auVar50);
                  pauVar25[-0x12] = auVar56;
                  auVar90._0_8_ = auVar64._0_8_ + *(long *)pauVar25[-0x11];
                  auVar90._8_8_ = auVar64._8_8_ + *(long *)(pauVar25[-0x11] + 8);
                  pauVar25[-0x11] = auVar90;
                  auVar67._0_8_ = (ulong)auVar50._8_4_ + *(long *)pauVar25[-0x10];
                  auVar67._8_8_ = (ulong)auVar50._12_4_ + *(long *)(pauVar25[-0x10] + 8);
                  pauVar25[-0x10] = auVar67;
                  auVar50 = pmovzxwd(auVar56,*(undefined8 *)((long)puVar2 + lVar22 * 2));
                  auVar50 = pmaddwd(auVar50,auVar48);
                  auVar64 = pmovzxwd(auVar67,*(undefined8 *)((long)puVar2 + lVar22 * 2 + 8));
                  auVar75 = pmovzxdq(auVar90,auVar50);
                  auVar91._0_8_ = auVar75._0_8_ + *(long *)pauVar25[-0xf];
                  auVar91._8_8_ = auVar75._8_8_ + *(long *)(pauVar25[-0xf] + 8);
                  pauVar25[-0xf] = auVar91;
                  auVar57._0_8_ = (ulong)auVar50._8_4_ + *(long *)pauVar25[-0xe];
                  auVar57._8_8_ = (ulong)auVar50._12_4_ + *(long *)(pauVar25[-0xe] + 8);
                  auVar50 = pmaddwd(auVar64,auVar48);
                  auVar64 = pmovzxdq(auVar91,auVar50);
                  pauVar25[-0xe] = auVar57;
                  auVar92._0_8_ = auVar64._0_8_ + *(long *)pauVar25[-0xd];
                  auVar92._8_8_ = auVar64._8_8_ + *(long *)(pauVar25[-0xd] + 8);
                  pauVar25[-0xd] = auVar92;
                  auVar68._0_8_ = (ulong)auVar50._8_4_ + *(long *)pauVar25[-0xc];
                  auVar68._8_8_ = (ulong)auVar50._12_4_ + *(long *)(pauVar25[-0xc] + 8);
                  pauVar25[-0xc] = auVar68;
                  auVar50 = pmovzxwd(auVar57,*(undefined8 *)((long)puVar2 + lVar41 * 2));
                  auVar50 = pmaddwd(auVar50,auVar48);
                  auVar64 = pmovzxwd(auVar68,*(undefined8 *)((long)puVar2 + lVar41 * 2 + 8));
                  auVar75 = pmovzxdq(auVar92,auVar50);
                  auVar93._0_8_ = auVar75._0_8_ + *(long *)pauVar25[-0xb];
                  auVar93._8_8_ = auVar75._8_8_ + *(long *)(pauVar25[-0xb] + 8);
                  pauVar25[-0xb] = auVar93;
                  auVar58._0_8_ = (ulong)auVar50._8_4_ + *(long *)pauVar25[-10];
                  auVar58._8_8_ = (ulong)auVar50._12_4_ + *(long *)(pauVar25[-10] + 8);
                  auVar50 = pmaddwd(auVar64,auVar48);
                  auVar64 = pmovzxdq(auVar93,auVar50);
                  pauVar25[-10] = auVar58;
                  auVar94._0_8_ = auVar64._0_8_ + *(long *)pauVar25[-9];
                  auVar94._8_8_ = auVar64._8_8_ + *(long *)(pauVar25[-9] + 8);
                  pauVar25[-9] = auVar94;
                  auVar69._0_8_ = (ulong)auVar50._8_4_ + *(long *)pauVar25[-8];
                  auVar69._8_8_ = (ulong)auVar50._12_4_ + *(long *)(pauVar25[-8] + 8);
                  pauVar25[-8] = auVar69;
                  auVar50 = pmovzxwd(auVar58,*(undefined8 *)((long)puVar2 + lVar14 * 2));
                  auVar50 = pmaddwd(auVar50,auVar48);
                  auVar64 = pmovzxwd(auVar69,*(undefined8 *)((long)puVar2 + lVar14 * 2 + 8));
                  auVar75 = pmovzxdq(auVar94,auVar50);
                  auVar95._0_8_ = auVar75._0_8_ + *(long *)pauVar25[-7];
                  auVar95._8_8_ = auVar75._8_8_ + *(long *)(pauVar25[-7] + 8);
                  pauVar25[-7] = auVar95;
                  auVar59._0_8_ = (ulong)auVar50._8_4_ + *(long *)pauVar25[-6];
                  auVar59._8_8_ = (ulong)auVar50._12_4_ + *(long *)(pauVar25[-6] + 8);
                  auVar50 = pmaddwd(auVar64,auVar48);
                  auVar64 = pmovzxdq(auVar95,auVar50);
                  pauVar25[-6] = auVar59;
                  auVar96._0_8_ = auVar64._0_8_ + *(long *)pauVar25[-5];
                  auVar96._8_8_ = auVar64._8_8_ + *(long *)(pauVar25[-5] + 8);
                  pauVar25[-5] = auVar96;
                  auVar70._0_8_ = (ulong)auVar50._8_4_ + *(long *)pauVar25[-4];
                  auVar70._8_8_ = (ulong)auVar50._12_4_ + *(long *)(pauVar25[-4] + 8);
                  pauVar25[-4] = auVar70;
                  auVar50 = pmovzxwd(auVar59,*(undefined8 *)((long)puVar2 + lVar15 * 2));
                  auVar50 = pmaddwd(auVar50,auVar48);
                  auVar64 = pmovzxwd(auVar70,*(undefined8 *)((long)puVar2 + lVar15 * 2 + 8));
                  auVar75 = pmovzxdq(auVar96,auVar50);
                  in_XMM5._0_8_ = auVar75._0_8_ + *(long *)pauVar25[-3];
                  in_XMM5._8_8_ = auVar75._8_8_ + *(long *)(pauVar25[-3] + 8);
                  pauVar25[-3] = in_XMM5;
                  in_XMM3._0_8_ = (ulong)auVar50._8_4_ + *(long *)pauVar25[-2];
                  in_XMM3._8_8_ = (ulong)auVar50._12_4_ + *(long *)(pauVar25[-2] + 8);
                  auVar64 = pmaddwd(auVar64,auVar48);
                  auVar50 = pmovzxdq(auVar48,auVar64);
                  pauVar25[-2] = in_XMM3;
                  lVar12 = *(long *)(pauVar25[-1] + 8);
                  *(long *)pauVar25[-1] = auVar50._0_8_ + *(long *)pauVar25[-1];
                  *(long *)(pauVar25[-1] + 8) = auVar50._8_8_ + lVar12;
                  in_XMM4._0_8_ = (ulong)auVar64._8_4_ + *(long *)*pauVar25;
                  in_XMM4._8_8_ = (ulong)auVar64._12_4_ + *(long *)(*pauVar25 + 8);
                  *pauVar25 = in_XMM4;
                  lVar20 = lVar20 + 2;
                  pauVar25 = pauVar25 + 0xc4;
                } while (lVar20 != 0xe);
                lVar42 = lVar42 + 1;
                plVar24 = plVar24 + 7;
                puVar35 = puVar35 + 0x1c;
                lVar28 = lVar28 + lVar33;
                pauVar40 = pauVar40 + 0x1c;
              } while (lVar42 != 7);
              iVar46 = iVar46 + uVar10;
            }
            lVar16 = lVar16 + 1;
            lVar36 = lVar36 + lVar33;
            lVar32 = lVar32 + lVar33;
          } while (lVar16 < iVar9 + iVar18);
        }
        lVar29 = lVar29 + 0x40;
        local_5890 = local_5890 + lVar39 * 0x80;
        local_5898 = local_5898 + lVar39 * 0x80;
      } while ((int)lVar29 < v_end);
    }
    lVar17 = 0x10;
    if (bit_depth != AOM_BITS_12) {
      lVar17 = (ulong)(bit_depth == AOM_BITS_10) * 3 + 1;
    }
    uVar11 = uVar11 / uVar13 & 0xffff;
    lVar33 = uVar13 * uVar11 * uVar11;
    lVar39 = 0;
    puVar35 = local_55f8;
    do {
      lVar22 = 0;
      piVar23 = H;
      puVar44 = puVar35;
      do {
        iVar9 = *(int *)(local_5858 + lVar22 * 4 + lVar39 * 0x1c);
        M[lVar22 * 7 + lVar39] =
             (long)((local_5788[lVar39 * 7 + lVar22] + lVar33) -
                   ((long)iVar9 + (long)iVar46) * uVar11) / lVar17;
        piVar37 = (int *)local_5858;
        lVar41 = 0;
        piVar27 = piVar23;
        puVar43 = puVar44;
        do {
          lVar14 = 0;
          piVar38 = piVar37;
          do {
            *(long *)((long)piVar27 + lVar14) =
                 (long)((*(long *)(puVar43 + lVar14 * 8) + lVar33) -
                       ((long)*piVar38 + (long)iVar9) * uVar11) / lVar17;
            lVar14 = lVar14 + 8;
            piVar38 = piVar38 + 7;
          } while (lVar14 != 0x38);
          lVar41 = lVar41 + 1;
          piVar27 = piVar27 + 7;
          piVar37 = piVar37 + 1;
          puVar43 = puVar43 + 8;
        } while (lVar41 != 7);
        lVar22 = lVar22 + 1;
        piVar23 = piVar23 + 0x157;
        puVar44 = puVar44 + 0xc40;
      } while (lVar22 != 7);
      lVar39 = lVar39 + 1;
      H = H + 0x31;
      puVar35 = puVar35 + 0x1c0;
    } while (lVar39 != 7);
  }
  return;
}

Assistant:

void av1_compute_stats_highbd_sse4_1(int wiener_win, const uint8_t *dgd8,
                                     const uint8_t *src8, int16_t *dgd_avg,
                                     int16_t *src_avg, int h_start, int h_end,
                                     int v_start, int v_end, int dgd_stride,
                                     int src_stride, int64_t *M, int64_t *H,
                                     aom_bit_depth_t bit_depth) {
  if (wiener_win == WIENER_WIN) {
    (void)dgd_avg;
    (void)src_avg;
    compute_stats_highbd_win7_opt_sse4_1(dgd8, src8, h_start, h_end, v_start,
                                         v_end, dgd_stride, src_stride, M, H,
                                         bit_depth);
  } else if (wiener_win == WIENER_WIN_CHROMA) {
    (void)dgd_avg;
    (void)src_avg;
    compute_stats_highbd_win5_opt_sse4_1(dgd8, src8, h_start, h_end, v_start,
                                         v_end, dgd_stride, src_stride, M, H,
                                         bit_depth);
  } else {
    av1_compute_stats_highbd_c(wiener_win, dgd8, src8, dgd_avg, src_avg,
                               h_start, h_end, v_start, v_end, dgd_stride,
                               src_stride, M, H, bit_depth);
  }
}